

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

reference __thiscall
jsoncons::jsonpath::detail::
identifier_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(identifier_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  size_t sVar1;
  result_options rVar2;
  bool bVar3;
  int iVar4;
  reference pbVar5;
  size_t sVar6;
  value_type *pvVar7;
  undefined4 extraout_var;
  reference pbVar9;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar10;
  uint uVar11;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *i;
  supertype *psVar12;
  object_iterator oVar13;
  type tVar14;
  string_view_type sVar15;
  int64_t n;
  error_code *peVar16;
  path_node_type *local_90;
  allocator<char> local_71;
  path_node_type *local_70;
  result_options local_64;
  error_code *local_60;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_58;
  undefined1 local_50 [16];
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_40;
  bool local_38;
  _func_int **pp_Var8;
  
  local_64 = options;
  bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(current);
  rVar2 = local_64;
  local_60 = ec;
  pbVar5 = current;
  local_90 = last;
  if (bVar3) {
    local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (this->identifier_)._M_string_length;
    oVar13 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                       ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)current,
                        (string_view_type *)local_50);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              ((object_range_type *)local_50,
               (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)current);
    rVar2 = local_64;
    if ((((undefined1  [16])oVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((local_38 & 1U) == 0)) {
      if (oVar13.has_value_ != local_38) goto LAB_003cc9be;
    }
    else if (oVar13.it_._M_current._M_current != local_40._M_current) {
LAB_003cc9be:
      local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
      local_50._0_8_ = (this->identifier_)._M_string_length;
      if ((local_64 & (path|sort|nodups)) != value) {
        local_70 = last;
        local_90 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,std::basic_string_view<char,std::char_traits<char>>const&>
                             ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                               *)context,&local_70,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_50);
      }
      pvVar7 = &(oVar13.it_._M_current._M_current)->value_;
      psVar12 = (this->
                super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ).tail_;
      if (psVar12 == (supertype *)0x0) {
        return pvVar7;
      }
      pp_Var8 = psVar12->_vptr_jsonpath_selector;
      peVar16 = local_60;
      goto LAB_003cca24;
    }
LAB_003cc9b4:
    pvVar7 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ::null_value(context);
  }
  else {
    while (uVar11 = *(byte *)&pbVar5->field_0 & 0xf, uVar11 - 8 < 2) {
      pbVar5 = *(reference *)((long)&(pbVar5->field_0).int64_ + 8);
    }
    if (uVar11 == 0xe) {
      local_58 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)0x0;
      tVar14 = jsoncons::detail::dec_to_integer<long,char>
                         ((this->identifier_)._M_dataplus._M_p,(this->identifier_)._M_string_length,
                          (long *)&local_58);
      peVar16 = local_60;
      if (tVar14.ec == success) {
        i = local_58;
        if ((long)local_58 < 0) {
          sVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current);
          i = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)((long)&(local_58->key_)._M_dataplus._M_p + sVar6);
        }
        pkVar10 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current)
        ;
        if (i < pkVar10) {
          local_50._0_8_ = i;
          if ((rVar2 & (path|sort|nodups)) != value) {
            local_70 = last;
            local_90 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                       ::
                       create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                                 ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                                   *)context,&local_70,(unsigned_long *)local_50);
          }
          pvVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                             (current,(size_t)i);
          psVar12 = (this->
                    super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ).tail_;
          if (psVar12 == (supertype *)0x0) {
            return pvVar7;
          }
          pp_Var8 = psVar12->_vptr_jsonpath_selector;
          goto LAB_003cca24;
        }
      }
      else {
        sVar1 = (this->identifier_)._M_string_length;
        if ((sVar1 == (context->length_label_)._M_string_length) &&
           (((sVar1 == 0 ||
             (iVar4 = bcmp((this->identifier_)._M_dataplus._M_p,
                           (context->length_label_)._M_dataplus._M_p,sVar1), iVar4 == 0)) &&
            (sVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current)
            , sVar6 != 0)))) {
          local_50._0_8_ =
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current);
          local_70 = (path_node_type *)((ulong)local_70 & 0xffffffffffffff00);
          pvVar7 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                   ::create_json<unsigned_long,jsoncons::semantic_tag,std::allocator<char>>
                             ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                               *)context,(unsigned_long *)local_50,(semantic_tag *)&local_70,
                              &local_71);
          goto LAB_003ccb63;
        }
      }
      goto LAB_003cc9b4;
    }
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(current);
    if (((!bVar3) ||
        (sVar1 = (this->identifier_)._M_string_length,
        sVar1 != (context->length_label_)._M_string_length)) ||
       ((sVar1 != 0 &&
        (iVar4 = bcmp((this->identifier_)._M_dataplus._M_p,(context->length_label_)._M_dataplus._M_p
                      ,sVar1), iVar4 != 0)))) {
      pbVar9 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ::null_value(context);
      return pbVar9;
    }
    sVar15 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                       (current);
    local_58 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)unicode_traits::count_codepoints<char>(sVar15._M_str,sVar15._M_len,strict);
    local_50._0_8_ = local_50._0_8_ & 0xffffffffffffff00;
    pvVar7 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
             ::create_json<unsigned_long&,jsoncons::semantic_tag,std::allocator<char>>
                       ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                         *)context,(unsigned_long *)&local_58,local_50,(allocator<char> *)&local_70)
    ;
LAB_003ccb63:
    local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (this->identifier_)._M_string_length;
    if ((rVar2 & (path|sort|nodups)) != value) {
      local_70 = last;
      local_90 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                 ::
                 create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,std::basic_string_view<char,std::char_traits<char>>const&>
                           ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                             *)context,&local_70,
                            (basic_string_view<char,_std::char_traits<char>_> *)local_50);
    }
    psVar12 = (this->
              super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ).tail_;
    if (psVar12 == (supertype *)0x0) {
      return pvVar7;
    }
    pp_Var8 = psVar12->_vptr_jsonpath_selector;
    peVar16 = local_60;
LAB_003cca24:
    iVar4 = (*pp_Var8[3])(psVar12,context,root,local_90,pvVar7,(ulong)rVar2,peVar16);
    pvVar7 = (value_type *)CONCAT44(extraout_var,iVar4);
  }
  return pvVar7;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            if (current.is_object())
            {
                auto it = current.find(identifier_);
                if (it != current.object_range().end())
                {
                    return this->evaluate_tail(context, root, 
                                               path_generator_type::generate(context, last, identifier_, options),
                                              (*it).value(), options, ec);
                }
                return context.null_value();
            }
            if (current.is_array())
            {
                int64_t n{0};
                auto r = jsoncons::detail::dec_to_integer(identifier_.data(), identifier_.size(), n);
                if (r)
                {
                    auto index = (n >= 0) ? static_cast<std::size_t>(n) : static_cast<std::size_t>(static_cast<int64_t>(current.size()) + n);
                    if (index < current.size())
                    {
                        return this->evaluate_tail(context, root, 
                                                   path_generator_type::generate(context, last, index, options),
                                                   current[index], options, ec);
                    }
                    return context.null_value();
                }
                if (identifier_ == context.length_label() && current.size() > 0)
                {
                    pointer ptr = context.create_json(current.size(), semantic_tag::none, context.get_allocator());
                    return this->evaluate_tail(context, root, 
                                               path_generator_type::generate(context, last, identifier_, options), 
                                               *ptr, 
                                               options, ec);
                }
                return context.null_value();
            }
            if (current.is_string() && identifier_ == context.length_label())
            {
                string_view_type sv = current.as_string_view();
                std::size_t count = unicode_traits::count_codepoints(sv.data(), sv.size());
                pointer ptr = context.create_json(count, semantic_tag::none, context.get_allocator());
                return this->evaluate_tail(context, root, 
                                           path_generator_type::generate(context, last, identifier_, options), 
                                           *ptr, options, ec);
            }
            return context.null_value();
        }